

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackRPMGenerator.cxx
# Opt level: O3

int __thiscall cmCPackRPMGenerator::PackageFiles(cmCPackRPMGenerator *this)

{
  ComponentPackageMethod CVar1;
  cmCPackLog *this_00;
  int iVar2;
  ostream *poVar3;
  size_t length;
  ostringstream cmCPackLog_msg;
  long *local_1b0;
  long local_1a0 [2];
  undefined1 local_190 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [6];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Toplevel: ",10);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(this->super_cmCPackGenerator).toplevel._M_dataplus._M_p,
                      (this->super_cmCPackGenerator).toplevel._M_string_length);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  this_00 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::stringbuf::str();
  length = strlen((char *)local_1b0);
  cmCPackLog::Log(this_00,4,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                  ,0x189,(char *)local_1b0,length);
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,local_1a0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  iVar2 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x17])(this);
  if ((char)iVar2 == '\0') {
    local_190._0_8_ = local_190 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"");
    iVar2 = PackageComponentsAllInOne(this,(string *)local_190);
  }
  else {
    CVar1 = (this->super_cmCPackGenerator).componentPackageMethod;
    if (CVar1 != ONE_PACKAGE) {
      iVar2 = PackageComponents(this,CVar1 == ONE_PACKAGE_PER_COMPONENT);
      return iVar2;
    }
    local_190._0_8_ = local_190 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"ALL_COMPONENTS_IN_ONE","");
    iVar2 = PackageComponentsAllInOne(this,(string *)local_190);
  }
  if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
    operator_delete((void *)local_190._0_8_,local_180[0]._M_allocated_capacity + 1);
  }
  return iVar2;
}

Assistant:

int cmCPackRPMGenerator::PackageFiles()
{
  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Toplevel: " << toplevel << std::endl);

  /* Are we in the component packaging case */
  if (WantsComponentInstallation()) {
    // CASE 1 : COMPONENT ALL-IN-ONE package
    // If ALL COMPONENTS in ONE package has been requested
    // then the package file is unique and should be open here.
    if (componentPackageMethod == ONE_PACKAGE) {
      return PackageComponentsAllInOne("ALL_COMPONENTS_IN_ONE");
    }
    // CASE 2 : COMPONENT CLASSICAL package(s) (i.e. not all-in-one)
    // There will be 1 package for each component group
    // however one may require to ignore component group and
    // in this case you'll get 1 package for each component.
    return PackageComponents(componentPackageMethod ==
                             ONE_PACKAGE_PER_COMPONENT);
  }
  // CASE 3 : NON COMPONENT package.
  return PackageComponentsAllInOne("");
}